

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::CharSet<char16_t>::GetNextRange
          (CharSet<char16_t> *this,Char searchCharStart,Char *outLowerChar,Char *outHigherChar)

{
  CharBitvec *this_00;
  size_t sVar1;
  CharSetNode *pCVar2;
  code *pcVar3;
  uint uVar4;
  char16 cVar5;
  Char CVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  undefined4 *puVar10;
  uint uVar11;
  uint index;
  bool bVar12;
  char cVar13;
  Char local_3c;
  Char local_3a;
  uint local_38;
  Char tempLowChar;
  Char tempHighChar;
  
  sVar1 = (this->rep).compact.countPlusOne;
  if (sVar1 - 1 < 5) {
    uVar7 = (int)sVar1 - 1;
  }
  else {
    pCVar2 = (this->rep).full.root;
    if (pCVar2 == (CharSetNode *)0x0) {
      uVar7 = CharBitvec::Count(&(this->rep).full.direct);
    }
    else {
      if ((pCVar2 != (CharSetNode *)&CharSetFull::Instance) &&
         (uVar11 = (*pCVar2->_vptr_CharSetNode[0xb])(pCVar2,2), 0xff00 < uVar11)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                            ,0x252,
                            "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                            ,
                            "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                           );
        if (!bVar12) goto LAB_00e7013f;
        *puVar10 = 0;
      }
      uVar7 = CharBitvec::Count(&(this->rep).full.direct);
      pCVar2 = (this->rep).full.root;
      if (pCVar2 == (CharSetNode *)&CharSetFull::Instance) {
        iVar8 = 0xff00;
      }
      else {
        iVar8 = (*pCVar2->_vptr_CharSetNode[0xb])(pCVar2,2);
      }
      uVar7 = iVar8 + uVar7;
    }
  }
  if (uVar7 == 0) {
    bVar12 = false;
  }
  else if (uVar7 == 1) {
    cVar5 = Singleton(this);
    bVar12 = (ushort)searchCharStart <= (ushort)cVar5;
    if (bVar12) {
      *outHigherChar = cVar5;
      *outLowerChar = cVar5;
      bVar12 = true;
    }
  }
  else if ((this->rep).compact.countPlusOne - 1 < 5) {
    Sort(this);
    if (4 < (this->rep).compact.countPlusOne - 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar12 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                          ,0x1ef,"(IsCompact())","IsCompact()");
      if (!bVar12) {
LAB_00e7013f:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar10 = 0;
    }
    local_38 = *(uint *)&this->rep;
    index = 0;
    uVar11 = local_38 - 1;
    if (local_38 != 1) {
      do {
        uVar7 = GetCompactCharU(this,index);
        CVar6 = (Char)uVar7;
        if ((ushort)searchCharStart <= (ushort)CVar6) {
          *outHigherChar = CVar6;
          *outLowerChar = CVar6;
          break;
        }
        index = index + 1;
      } while (uVar11 != index);
    }
    uVar4 = local_38;
    bVar12 = index != uVar11;
    uVar7 = index + 1;
    if (uVar7 < uVar11 && bVar12) {
      do {
        uVar9 = GetCompactCharU(this,uVar7);
        if ((ushort)*outHigherChar + 1 != (uVar9 & 0xffff)) {
          return bVar12;
        }
        *outHigherChar = (Char)((ushort)*outHigherChar + 1);
        iVar8 = uVar7 - uVar4;
        uVar7 = uVar7 + 1;
      } while (iVar8 != -2);
    }
  }
  else {
    uVar11 = (uint)(ushort)searchCharStart;
    if ((ushort)searchCharStart < 0x100) {
      this_00 = &(this->rep).full.direct;
      local_38 = (uint)(ushort)searchCharStart;
      iVar8 = CharBitvec::NextSet(this_00,(uint)(ushort)searchCharStart);
      if (iVar8 == -1) {
        bVar12 = false;
        cVar13 = '\x01';
      }
      else {
        *outLowerChar = (Char)iVar8;
        iVar8 = CharBitvec::NextClear(this_00,iVar8);
        cVar13 = iVar8 == -1;
        if ((bool)cVar13) {
          uVar11 = 0xff;
        }
        else {
          uVar11 = iVar8 - 1;
          if (0xffff < uVar11) {
            AssertCount = AssertCount + 1;
            tempHighChar._1_1_ = cVar13;
            Js::Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar10 = 1;
            bVar12 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                                ,0x89,"(u <= MaxUChar)","u <= MaxUChar");
            if (!bVar12) goto LAB_00e7013f;
            *puVar10 = 0;
            cVar13 = tempHighChar._1_1_;
          }
        }
        *outHigherChar = (Char)uVar11;
        bVar12 = true;
      }
      uVar11 = local_38;
      if (cVar13 == '\0') {
        return true;
      }
    }
    else {
      bVar12 = false;
    }
    pCVar2 = (this->rep).full.root;
    if (pCVar2 != (CharSetNode *)0x0) {
      local_3c = L'\0';
      local_3a = L'\0';
      if (bVar12 == false) {
        CVar6 = L'Ā';
        if (0x100 < uVar11) {
          CVar6 = searchCharStart;
        }
      }
      else {
        CVar6 = *outHigherChar + L'\x01';
      }
      iVar8 = (*pCVar2->_vptr_CharSetNode[0xc])(pCVar2,2,(ulong)(ushort)CVar6,&local_3c,&local_3a);
      if ((char)iVar8 != '\0') {
        if (bVar12 == false) {
          *outLowerChar = local_3c;
        }
        else if ((ushort)*outHigherChar + 1 != (uint)(ushort)local_3c) {
          return true;
        }
        *outHigherChar = local_3a;
        bVar12 = true;
      }
    }
  }
  return bVar12;
}

Assistant:

bool CharSet<char16>::GetNextRange(Char searchCharStart, _Out_ Char *outLowerChar, _Out_ Char *outHigherChar)
    {
        int count = this->Count();
        if (count == 0)
        {
            return false;
        }
        else if (count == 1)
        {
            Char singleton = this->Singleton();
            if (singleton < searchCharStart)
            {
                return false;
            }

            *outLowerChar = *outHigherChar = singleton;

            return true;
        }

        if (IsCompact())
        {
            this->Sort();
            uint i = 0;
            size_t compactLength = this->GetCompactLength();
            for (; i < compactLength; i++)
            {
                Char nextChar = this->GetCompactChar(i);
                if (nextChar >= searchCharStart)
                {
                    *outLowerChar = *outHigherChar = nextChar;
                    break;
                }
            }

            if (i == compactLength)
            {
                return false;
            }

            i++;

            for (; i < compactLength; i++)
            {
                Char nextChar = this->GetCompactChar(i);
                if (nextChar != *outHigherChar + 1)
                {
                    return true;
                }
                *outHigherChar += 1;
            }

            return true;
        }
        else
        {
            bool found = false;
            if (CTU(searchCharStart) < CharSetNode::directSize)
            {
                int nextSet = rep.full.direct.NextSet(searchCharStart);

                if (nextSet != -1)
                {
                    found = true;

                    *outLowerChar = (char16)nextSet;

                    int nextClear = rep.full.direct.NextClear(nextSet);

                    if (nextClear != -1)
                    {
                        *outHigherChar = UTC(nextClear - 1);
                        return true;
                    }

                    *outHigherChar = CharSetNode::directSize - 1;
                }
            }

            if (rep.full.root == nullptr)
            {
                return found;
            }
            Char tempLowChar = 0, tempHighChar = 0;

            if (found)
            {
                searchCharStart = *outHigherChar + 1;
            }
            else
            {
                searchCharStart = searchCharStart > CharSetNode::directSize ? searchCharStart : CharSetNode::directSize;
            }

            if (rep.full.root->GetNextRange(CharSetNode::levels - 1, searchCharStart, &tempLowChar, &tempHighChar) && (!found || tempLowChar == *outHigherChar + 1))
            {
                if (!found)
                {
                    *outLowerChar = tempLowChar;
                }
                *outHigherChar = tempHighChar;
                return true;
            }

            return found;
        }
    }